

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_23::Heap2LocalPass::doWalkFunction(Heap2LocalPass *this,Function *func)

{
  Expression **currp;
  Id IVar1;
  StructNew *pSVar2;
  anon_struct_8_0_00000001_for___align aVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined1 auVar6 [16];
  pointer ppSVar7;
  LocalGraphFlower **ppLVar8;
  __node_base_ptr currp_00;
  anon_struct_8_0_00000001_for___align __code;
  undefined1 auVar9 [8];
  bool bVar10;
  Index index;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *poVar11;
  HeapType left;
  LocalSet *left_00;
  mapped_type *pmVar12;
  __node_ptr __node;
  HeapType right;
  undefined1 auVar13 [8];
  char *pcVar14;
  Function *in_RDX;
  Expression **ppEVar15;
  ulong uVar16;
  TaskFunc p_Var17;
  pointer ppSVar18;
  Type type;
  StructNew *curr;
  Type in_R8;
  Module *pMVar19;
  byte bVar20;
  uint uVar21;
  pointer __ptr;
  optional<wasm::Type> type_00;
  Struct2Local local_a50;
  Function *local_920;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_918;
  LazyLocalGraph local_910;
  undefined1 local_7a0 [328];
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_658;
  undefined1 local_620 [264];
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  local_518;
  undefined1 auStack_4e8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> gets;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> local_490;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3b8;
  undefined1 auStack_378 [8];
  AllocationFinder finder;
  undefined1 local_260 [8];
  EscapeAnalyzer analyzer;
  undefined1 auStack_1b8 [8];
  EscapeAnalyzer analyzer_1;
  pointer pTStack_100;
  _Alloc_hider local_c8;
  Type local_c0;
  HeapType local_b8;
  bool local_b0;
  Index local_ac;
  anon_struct_8_0_00000001_for___align local_a8;
  anon_struct_8_0_00000001_for___align local_a0;
  undefined1 auStack_98 [8];
  Field element;
  undefined1 auStack_78 [8];
  FieldList fields;
  HeapType arrayType;
  
  poVar11 = &(this->
             super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>_>
             ).super_Pass.passArg;
  local_920 = func;
  local_918 = poVar11;
  LazyLocalGraph::LazyLocalGraph
            (&local_910,in_RDX,(Module *)func,(optional<wasm::Expression::Id>)0x0);
  Parents::Parents((Parents *)local_7a0,in_RDX->body);
  currp = &in_RDX->body;
  BranchUtils::BranchTargets::BranchTargets((BranchTargets *)local_620,*currp);
  auStack_378 = (undefined1  [8])0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep =
       (Expression **)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed._M_elems[9].
  currp = (Expression **)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currFunction =
       (Function *)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currModule = (Module *)0x0;
  finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
            ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)auStack_378,
             PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::scan,currp);
  type.id = ((long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                   .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                   flexible.
                   super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start -
             (long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                   .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                   fixed._M_elems[9].currp >> 4) +
            (long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep;
  if (type.id != 0) {
    do {
      if ((pointer)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                   .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                   fixed._M_elems[9].currp ==
          finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
          super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
            super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep ==
            (Expression **)0x0) {
          pcVar14 = 
          "T &wasm::SmallVector<wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::Task, 10>::back() [T = wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::Task, N = 10]"
          ;
LAB_008b402d:
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,pcVar14);
        }
        ppEVar15 = finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                   .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                   fixed._M_elems
                   [(long)finder.
                          super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                          .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                          replacep + -2].currp;
        auStack_378 = (undefined1  [8])
                      finder.
                      super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                      fixed._M_elems
                      [(long)finder.
                             super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                             .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                             .replacep + -1].func;
        finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
        super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep =
             (Expression **)
             ((long)finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep
             + -1);
      }
      else {
        ppEVar15 = (Expression **)
                   finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                   .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                   flexible.
                   super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_378 = (undefined1  [8])
                      finder.
                      super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
        super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
             super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_378 == (Expression *)0x0) {
        pcVar14 = 
        "void wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::walk(Expression *&) [SubType = AllocationFinder, VisitorType = wasm::Visitor<AllocationFinder>]"
        ;
LAB_008b400e:
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,pcVar14);
      }
      (*(code *)ppEVar15)((AllocationFinder *)auStack_378,(Expression **)auStack_378);
      type.id = ((long)finder.
                       super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                       super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                       flexible.
                       super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                 (long)finder.
                       super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                       super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                       fixed._M_elems[9].currp >> 4) +
                (long)finder.
                      super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                      replacep;
    } while (type.id != 0);
  }
  ppSVar7 = (pointer)CONCAT71(finder.arrayNews.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              finder.arrayNews.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_);
  if (finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage == ppSVar7) {
    bVar20 = 0;
  }
  else {
    bVar20 = 0;
    ppSVar18 = finder.structNews.
               super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    analyzer.reachedInteractions._M_h._M_single_bucket = (__node_base_ptr)currp;
    do {
      pSVar2 = *ppSVar18;
      bVar10 = Heap2Local::canHandleAsLocals
                         ((Heap2Local *)
                          (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).
                          super_Expression.type.id,type);
      if (bVar10) {
        local_260 = (undefined1  [8])&local_910;
        analyzer.localGraph = (LazyLocalGraph *)local_7a0;
        analyzer.parents = (Parents *)local_620;
        analyzer.wasm = (Module *)&analyzer.sets._M_h._M_rehash_policy._M_next_resize;
        analyzer.sets._M_h._M_buckets = (__buckets_ptr)0x1;
        analyzer.sets._M_h._M_bucket_count = 0;
        analyzer.sets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        analyzer.sets._M_h._M_element_count._0_4_ = 0x3f800000;
        analyzer.sets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        analyzer.sets._M_h._M_rehash_policy._4_4_ = 0;
        analyzer.sets._M_h._M_rehash_policy._M_next_resize = 0;
        analyzer.sets._M_h._M_single_bucket =
             (__node_base_ptr)&analyzer.reachedInteractions._M_h._M_rehash_policy._M_next_resize;
        analyzer.reachedInteractions._M_h._M_buckets = (__buckets_ptr)0x1;
        analyzer.reachedInteractions._M_h._M_bucket_count = 0;
        analyzer.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        analyzer.reachedInteractions._M_h._M_element_count._0_4_ = 0x3f800000;
        analyzer.reachedInteractions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        analyzer.reachedInteractions._M_h._M_rehash_policy._4_4_ = 0;
        analyzer.reachedInteractions._M_h._M_rehash_policy._M_next_resize = 0;
        curr = pSVar2;
        analyzer.branchTargets = (BranchTargets *)poVar11;
        analyzer.passOptions = (PassOptions *)func;
        bVar10 = EscapeAnalyzer::escapes((EscapeAnalyzer *)local_260,(Expression *)pSVar2);
        puVar4 = (undefined8 *)analyzer.reachedInteractions._M_h._M_bucket_count;
        if (!bVar10) {
          auStack_1b8 = (undefined1  [8])0x0;
          analyzer_1.localGraph = (LazyLocalGraph *)0x0;
          pTStack_100 = (pointer)0x0;
          local_c0.id = (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).
                        super_Expression.type.id;
          local_b8.id = 0x10;
          local_b0 = false;
          IVar1 = (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id;
          local_c8._M_p = (pointer)func;
          if (IVar1 == ArrayNewFixedId) {
            local_ac = (Index)(pSVar2->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
          }
          else {
            if (IVar1 != ArrayNewId) {
              handle_unreachable("bad allocation",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                                 ,0x4f1);
            }
            local_ac = Array2Struct::getIndex
                                 ((Array2Struct *)
                                  (pSVar2->operands).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  .usedElements,(Expression *)curr);
          }
          left = wasm::Type::getHeapType
                           (&(pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).
                             super_Expression.type);
          HeapType::getArray((HeapType *)auStack_4e8);
          auStack_98 = auStack_4e8;
          element.type.id =
               (uintptr_t)
               gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
          auStack_78 = (undefined1  [8])0x0;
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (local_ac != 0) {
            uVar21 = 0;
            do {
              if (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<wasm::Field,std::allocator<wasm::Field>>::
                _M_realloc_insert<wasm::Field_const&>
                          ((vector<wasm::Field,std::allocator<wasm::Field>> *)auStack_78,
                           (iterator)
                           fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                           _M_impl.super__Vector_impl_data._M_start,(Field *)auStack_98);
              }
              else {
                ((fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start)->type).id = (uintptr_t)auStack_98;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->packedType = (undefined4)element.type.id;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->mutable_ = element.type.id._4_4_;
                fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                super__Vector_impl_data._M_start =
                     fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < local_ac);
          }
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_4e8,
                     (vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_78);
          HeapType::HeapType(&arrayType,(Struct *)auStack_4e8);
          local_b8.id = arrayType.id;
          if (auStack_4e8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_4e8,
                            (long)gets.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_4e8);
          }
          IVar1 = (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id;
          if (IVar1 == ArrayNewFixedId) {
            local_a8 = (anon_struct_8_0_00000001_for___align)
                       Builder::makeStructNew<ArenaVector<wasm::Expression*>>
                                 ((Builder *)&local_c8,local_b8,&pSVar2->operands);
            local_a0 = local_a8;
          }
          else {
            if (IVar1 != ArrayNewId) {
              handle_unreachable("bad allocation",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                                 ,0x435);
            }
            if ((pSVar2->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data ==
                (Expression **)0x0) {
              local_a8 = (anon_struct_8_0_00000001_for___align)
                         Builder::makeStructNew
                                   ((Builder *)&local_c8,local_b8,
                                    (initializer_list<wasm::Expression_*>)ZEXT816(0));
              local_a0 = local_a8;
            }
            else {
              auVar6._8_8_ = 0;
              auVar6._0_8_ = auStack_98;
              auVar13 = auStack_98;
              index = Builder::addVar((Builder *)in_RDX,(Function *)0x0,(Name)(auVar6 << 0x40),in_R8
                                     );
              left_00 = Builder::makeLocalSet
                                  ((Builder *)&local_c8,index,
                                   (Expression *)
                                   (pSVar2->operands).
                                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   .data);
              auStack_4e8 = (undefined1  [8])0x0;
              gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              if (local_ac != 0) {
                uVar21 = 0;
                do {
                  auVar9 = auStack_98;
                  arrayType.id = (uintptr_t)
                                 MixedArena::allocSpace
                                           ((MixedArena *)(local_c8._M_p + 0x200),0x18,8);
                  *(undefined1 *)arrayType.id = 8;
                  *(Index *)(arrayType.id + 0x10) = index;
                  *(undefined1 (*) [8])(arrayType.id + 8) = auVar9;
                  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                  emplace_back<wasm::Expression*>
                            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                             auStack_4e8,(Expression **)&arrayType);
                  uVar21 = uVar21 + 1;
                } while (uVar21 < local_ac);
              }
              local_a8 = (anon_struct_8_0_00000001_for___align)
                         Builder::
                         makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                   ((Builder *)&local_c8,local_b8,
                                    (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)auStack_4e8);
              in_R8.id = 0;
              type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   (_Storage<wasm::Type,_true>)auVar13;
              local_a0 = (anon_struct_8_0_00000001_for___align)
                         Builder::makeSequence
                                   ((Builder *)&local_c8,(Expression *)left_00,
                                    (Expression *)local_a8,type_00);
              if (auStack_4e8 != (undefined1  [8])0x0) {
                operator_delete((void *)auStack_4e8,
                                (long)gets.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_4e8
                               );
              }
            }
          }
          pmVar12 = std::
                    unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                    ::operator[]((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                                  *)&analyzer.sets._M_h._M_single_bucket,(key_type *)&local_a0);
          __code = local_a8;
          *pmVar12 = Flows;
          uVar16 = (ulong)local_a8 % (ulong)analyzer.reachedInteractions._M_h._M_buckets;
          if (analyzer.sets._M_h._M_single_bucket[uVar16]._M_nxt != (_Hash_node_base *)0x0) {
            __node = (__node_ptr)(analyzer.sets._M_h._M_single_bucket[uVar16]._M_nxt)->_M_nxt;
            aVar3 = (__node->
                    super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
                    ).
                    super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
                    ._M_storage._M_storage.__align;
            do {
              if (aVar3 == local_a8) goto LAB_008b3a31;
              __node = (__node_ptr)(__node->super__Hash_node_base)._M_nxt;
            } while ((__node != (__node_ptr)0x0) &&
                    (aVar3 = *(anon_struct_8_0_00000001_for___align *)
                              &(__node->
                               super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
                               ._M_storage._M_storage,
                    (ulong)aVar3 % (ulong)analyzer.reachedInteractions._M_h._M_buckets == uVar16));
          }
          __node = (__node_ptr)operator_new(0x18);
          (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
          *(anon_struct_8_0_00000001_for___align *)
           &(__node->
            super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
            ).
            super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
            ._M_storage._M_storage = __code;
          (__node->
          super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
          ).
          super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
          ._M_storage._M_storage.__data[8] = '\0';
          std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_insert_unique_node
                    ((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)&analyzer.sets._M_h._M_single_bucket,uVar16,(__hash_code)__code,__node,
                     in_R8.id);
LAB_008b3a31:
          currp_00 = analyzer.reachedInteractions._M_h._M_single_bucket;
          (__node->
          super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
          ).
          super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
          ._M_storage._M_storage.__data[8] = '\x02';
          for (puVar4 = (undefined8 *)analyzer.reachedInteractions._M_h._M_bucket_count;
              puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
            pcVar14 = (char *)puVar4[1];
            if ((*pcVar14 != '?') &&
               ((*(ulong *)(pcVar14 + 8) & 1) == 0 && 6 < *(ulong *)(pcVar14 + 8))) {
              right = wasm::Type::getHeapType((Type *)(pcVar14 + 8));
              bVar10 = HeapType::isSubType(left,right);
              if (bVar10) {
                if (left.id != right.id) {
                  local_b0 = true;
                }
                if (((uint)(0x7c < local_b8.id) * 4 + 3 & (uint)local_b8.id) != 0) {
                  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
                }
                uVar16 = *(ulong *)(puVar4[1] + 8);
                *(ulong *)(puVar4[1] + 8) =
                     (uint)(((uint)uVar16 & 3) == 2 && 6 < uVar16) * 2 | local_b8.id;
              }
            }
          }
          if (analyzer_1.localGraph != (LazyLocalGraph *)0x0) {
            __assert_fail("stack.size() == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                          ,0x12d,
                          "void wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Array2Struct, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>]"
                         );
          }
          Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
          ::pushTask((Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
                      *)auStack_1b8,
                     PostWalker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
                     ::scan,(Expression **)currp_00);
          while ((long)&((analyzer_1.localGraph)->super_LocalGraphBase).func +
                 ((long)pTStack_100 >> 4) != 0) {
            if (pTStack_100 == (pointer)0x0) {
              if (analyzer_1.localGraph == (LazyLocalGraph *)0x0) {
                pcVar14 = 
                "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::Task, N = 10]"
                ;
                goto LAB_008b402d;
              }
              ppLVar8 = &analyzer_1.localGraph[-1].flower._M_t.
                         super___uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>
                         .super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>._M_head_impl;
              analyzer_1.localGraph = (LazyLocalGraph *)((long)ppLVar8 + 7);
              p_Var17 = (TaskFunc)
                        (&analyzer_1.reachedInteractions._M_h._M_element_count)[(long)ppLVar8 * 2];
              auStack_1b8 = *(undefined1 (*) [8])
                             (&analyzer_1.reachedInteractions._M_h._M_rehash_policy + (long)ppLVar8)
              ;
            }
            else {
              p_Var17 = pTStack_100[-1].func;
              auStack_1b8 = (undefined1  [8])pTStack_100[-1].currp;
              pTStack_100 = pTStack_100 + -1;
            }
            if ((((LazyLocalGraph *)auStack_1b8)->super_LocalGraphBase).func == (Function *)0x0) {
              pcVar14 = 
              "void wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Array2Struct, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>]"
              ;
              goto LAB_008b400e;
            }
            (*p_Var17)((Array2Struct *)auStack_1b8,(Expression **)auStack_1b8);
          }
          if (local_b0 == true) {
            ReFinalize::ReFinalize((ReFinalize *)auStack_4e8);
            local_490.currModule = (Module *)func;
            Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
                      (&local_490,(Expression **)currp_00);
            local_490.currFunction = (Function *)0x0;
            local_490.currModule = (Module *)0x0;
            auStack_4e8 = (undefined1  [8])&PTR__ReFinalize_01070c30;
            std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_3b8);
            if (local_490.stack.flexible.
                super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_490.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_490.stack.flexible.
                                    super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_490.stack.flexible.
                                    super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            Pass::~Pass((Pass *)auStack_4e8);
          }
          if (auStack_78 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_78,
                            (long)fields.
                                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
          }
          in_R8.id = (uintptr_t)func;
          Struct2Local::Struct2Local
                    (&local_a50,(StructNew *)local_a8,(EscapeAnalyzer *)local_260,in_RDX,
                     (Module *)func);
          if (local_a50.localIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a50.localIndexes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a50.localIndexes.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a50.localIndexes.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          bVar20 = 1;
          puVar4 = (undefined8 *)analyzer.reachedInteractions._M_h._M_bucket_count;
          if (local_a50.
              super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
              .stack.flexible.
              super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a50.
                            super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a50.
                                  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                                  .
                                  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                                  .stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a50.
                                  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                                  .
                                  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                                  .stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            puVar4 = (undefined8 *)analyzer.reachedInteractions._M_h._M_bucket_count;
          }
        }
        while (puVar4 != (undefined8 *)0x0) {
          puVar5 = (undefined8 *)*puVar4;
          operator_delete(puVar4,0x18);
          puVar4 = puVar5;
        }
        type.id = 0;
        memset(analyzer.sets._M_h._M_single_bucket,0,
               (long)analyzer.reachedInteractions._M_h._M_buckets << 3);
        analyzer.reachedInteractions._M_h._M_bucket_count = 0;
        analyzer.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        if ((__node_base_ptr)&analyzer.reachedInteractions._M_h._M_rehash_policy._M_next_resize !=
            analyzer.sets._M_h._M_single_bucket) {
          type.id = (long)analyzer.reachedInteractions._M_h._M_buckets << 3;
          operator_delete(analyzer.sets._M_h._M_single_bucket,type.id);
        }
        std::
        _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&analyzer.wasm);
      }
      ppSVar18 = ppSVar18 + 1;
    } while (ppSVar18 != ppSVar7);
  }
  ppSVar7 = finder.structNews.
            super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currModule !=
      (Module *)
      finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pMVar19 = finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
              super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currModule;
    do {
      pSVar2 = (StructNew *)
               (pMVar19->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar10 = Heap2Local::canHandleAsLocals
                         ((Heap2Local *)
                          (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).
                          super_Expression.type.id,type);
      if (bVar10) {
        auStack_1b8 = (undefined1  [8])&local_910;
        analyzer_1.localGraph = (LazyLocalGraph *)local_7a0;
        analyzer_1.parents = (Parents *)local_620;
        analyzer_1.wasm = (Module *)&analyzer_1.sets._M_h._M_rehash_policy._M_next_resize;
        analyzer_1.sets._M_h._M_buckets = (__buckets_ptr)0x1;
        analyzer_1.sets._M_h._M_bucket_count = 0;
        analyzer_1.sets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        analyzer_1.sets._M_h._M_element_count._0_4_ = 0x3f800000;
        analyzer_1.sets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        analyzer_1.sets._M_h._M_rehash_policy._4_4_ = 0;
        analyzer_1.sets._M_h._M_rehash_policy._M_next_resize = 0;
        analyzer_1.sets._M_h._M_single_bucket =
             (__node_base_ptr)&analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_next_resize;
        analyzer_1.reachedInteractions._M_h._M_buckets = (__buckets_ptr)0x1;
        analyzer_1.reachedInteractions._M_h._M_bucket_count = 0;
        analyzer_1.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        analyzer_1.reachedInteractions._M_h._M_element_count._0_4_ = 0x3f800000;
        analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        analyzer_1.reachedInteractions._M_h._M_rehash_policy._4_4_ = 0;
        analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_next_resize = 0;
        analyzer_1.branchTargets = (BranchTargets *)poVar11;
        analyzer_1.passOptions = (PassOptions *)func;
        bVar10 = EscapeAnalyzer::escapes((EscapeAnalyzer *)auStack_1b8,(Expression *)pSVar2);
        puVar4 = (undefined8 *)analyzer_1.reachedInteractions._M_h._M_bucket_count;
        if (!bVar10) {
          Struct2Local::Struct2Local
                    ((Struct2Local *)auStack_4e8,pSVar2,(EscapeAnalyzer *)auStack_1b8,in_RDX,
                     (Module *)func);
          if (local_490.stack.flexible.
              super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_490.stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_490.stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_490.stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar20 = 1;
          puVar4 = (undefined8 *)analyzer_1.reachedInteractions._M_h._M_bucket_count;
          if ((pointer)local_490.stack.fixed._M_elems[4].currp != (pointer)0x0) {
            operator_delete(local_490.stack.fixed._M_elems[4].currp,
                            (long)local_490.stack.fixed._M_elems[5].currp -
                            (long)local_490.stack.fixed._M_elems[4].currp);
            puVar4 = (undefined8 *)analyzer_1.reachedInteractions._M_h._M_bucket_count;
          }
        }
        while (puVar4 != (undefined8 *)0x0) {
          puVar5 = (undefined8 *)*puVar4;
          operator_delete(puVar4,0x18);
          puVar4 = puVar5;
        }
        type.id = 0;
        memset(analyzer_1.sets._M_h._M_single_bucket,0,
               (long)analyzer_1.reachedInteractions._M_h._M_buckets << 3);
        analyzer_1.reachedInteractions._M_h._M_bucket_count = 0;
        analyzer_1.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        if ((__node_base_ptr)&analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_next_resize !=
            analyzer_1.sets._M_h._M_single_bucket) {
          type.id = (long)analyzer_1.reachedInteractions._M_h._M_buckets << 3;
          operator_delete(analyzer_1.sets._M_h._M_single_bucket,type.id);
        }
        std::
        _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&analyzer_1.wasm);
      }
      pMVar19 = (Module *)
                &(pMVar19->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (pMVar19 != (Module *)ppSVar7);
  }
  if (((byte)finder.arrayNews.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage & bVar20) != 0) {
    EHUtils::handleBlockNestedPops(in_RDX,(Module *)func,SkipIfNoEH);
  }
  if (finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(finder.structNews.
                    super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    CONCAT71(finder.arrayNews.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                             finder.arrayNews.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_1_) -
                    (long)finder.structNews.
                          super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currModule !=
      (Module *)0x0) {
    operator_delete(finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    currModule,
                    (long)finder.structNews.
                          super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.
                          super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                          .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                          currModule);
  }
  if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed._M_elems[9]
      .currp != (Expression **)0x0) {
    operator_delete(finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                    fixed._M_elems[9].currp,
                    (long)finder.
                          super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                          .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                          stack.flexible.
                          super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.
                          super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                          .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                          stack.fixed._M_elems[9].currp);
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  ::~_Rb_tree(&local_518);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Expression_*>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Expression_*>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Expression_*>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Expression_*>_>_>
               *)(local_620 + 0xd8));
  if ((pointer)local_620._176_8_ != (pointer)0x0) {
    operator_delete((void *)local_620._176_8_,local_620._192_8_ - local_620._176_8_);
  }
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_658);
  if ((pointer)local_7a0._304_8_ != (pointer)0x0) {
    operator_delete((void *)local_7a0._304_8_,local_7a0._320_8_ - local_7a0._304_8_);
  }
  if ((pointer)local_7a0._176_8_ != (pointer)0x0) {
    operator_delete((void *)local_7a0._176_8_,local_7a0._192_8_ - local_7a0._176_8_);
  }
  LazyLocalGraph::~LazyLocalGraph(&local_910);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // Multiple rounds of optimization may work in theory, as once we turn one
    // allocation into locals, references written to its fields become
    // references written to locals, which we may see do not escape. However,
    // this does not work yet, since we do not remove the original allocation -
    // we just "detach" it from other things and then depend on other
    // optimizations to remove it. That means this pass must be interleaved with
    // vacuum, in particular, to optimize such nested allocations.
    // TODO Consider running multiple iterations here, and running vacuum in
    //      between them.
    Heap2Local(func, *getModule(), getPassOptions());
  }